

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmInstallExportGenerator.cxx
# Opt level: O0

void __thiscall
cmInstallExportGenerator::cmInstallExportGenerator
          (cmInstallExportGenerator *this,cmExportSet *exportSet,char *destination,
          char *file_permissions,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *configurations,char *component,MessageLevel message,bool exclude_from_all,char *filename,
          char *name_space,bool exportOld,bool android)

{
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar1;
  cmExportInstallFileGenerator *pcVar2;
  allocator local_56;
  allocator local_55 [17];
  allocator local_44;
  byte local_43;
  byte local_42;
  undefined1 local_41;
  bool android_local;
  bool exportOld_local;
  char *pcStack_40;
  bool exclude_from_all_local;
  char *component_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *configurations_local;
  char *file_permissions_local;
  char *destination_local;
  cmExportSet *exportSet_local;
  cmInstallExportGenerator *this_local;
  
  local_41 = exclude_from_all;
  local_42 = exportOld;
  local_43 = android;
  pcStack_40 = component;
  component_local = (char *)configurations;
  configurations_local =
       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        *)file_permissions;
  file_permissions_local = destination;
  destination_local = (char *)exportSet;
  exportSet_local = (cmExportSet *)this;
  cmInstallGenerator::cmInstallGenerator
            (&this->super_cmInstallGenerator,destination,configurations,component,message,
             exclude_from_all);
  pvVar1 = configurations_local;
  (this->super_cmInstallGenerator).super_cmScriptGenerator._vptr_cmScriptGenerator =
       (_func_int **)&PTR__cmInstallExportGenerator_00cc1ae8;
  this->ExportSet = (cmExportSet *)destination_local;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&this->FilePermissions,(char *)pvVar1,&local_44);
  std::allocator<char>::~allocator((allocator<char> *)&local_44);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&this->FileName,filename,local_55);
  std::allocator<char>::~allocator((allocator<char> *)local_55);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&this->Namespace,name_space,&local_56);
  std::allocator<char>::~allocator((allocator<char> *)&local_56);
  this->ExportOld = (bool)(local_42 & 1);
  this->LocalGenerator = (cmLocalGenerator *)0x0;
  std::__cxx11::string::string((string *)&this->TempDir);
  std::__cxx11::string::string((string *)&this->MainImportFile);
  if ((local_43 & 1) == 0) {
    pcVar2 = (cmExportInstallFileGenerator *)operator_new(0x138);
    cmExportInstallFileGenerator::cmExportInstallFileGenerator(pcVar2,this);
    this->EFGen = pcVar2;
  }
  else {
    pcVar2 = (cmExportInstallFileGenerator *)operator_new(0x138);
    cmExportInstallAndroidMKGenerator::cmExportInstallAndroidMKGenerator
              ((cmExportInstallAndroidMKGenerator *)pcVar2,this);
    this->EFGen = pcVar2;
  }
  cmExportSet::AddInstallation((cmExportSet *)destination_local,this);
  return;
}

Assistant:

cmInstallExportGenerator::cmInstallExportGenerator(
  cmExportSet* exportSet, const char* destination,
  const char* file_permissions, std::vector<std::string> const& configurations,
  const char* component, MessageLevel message, bool exclude_from_all,
  const char* filename, const char* name_space, bool exportOld, bool android)
  : cmInstallGenerator(destination, configurations, component, message,
                       exclude_from_all)
  , ExportSet(exportSet)
  , FilePermissions(file_permissions)
  , FileName(filename)
  , Namespace(name_space)
  , ExportOld(exportOld)
  , LocalGenerator(CM_NULLPTR)
{
  if (android) {
#ifdef CMAKE_BUILD_WITH_CMAKE
    this->EFGen = new cmExportInstallAndroidMKGenerator(this);
#endif
  } else {
    this->EFGen = new cmExportInstallFileGenerator(this);
  }
  exportSet->AddInstallation(this);
}